

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O3

void __thiscall
libtorrent::http_stream::name_lookup(http_stream *this,error_code *e,iterator *i,handler_type *h)

{
  undefined8 *puVar1;
  long lVar2;
  _Manager_type p_Var3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  data_union dStack_78;
  _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
  local_50;
  
  bVar5 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar5) {
    lVar2 = (long)(((i->values_).
                    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->
                  super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = i->index_ * 0x60;
    puVar1 = (undefined8 *)(lVar2 + lVar6);
    dStack_78._0_8_ = *puVar1;
    uVar4 = puVar1[1];
    puVar1 = (undefined8 *)(lVar2 + 0xc + lVar6);
    dStack_78._20_8_ = puVar1[1];
    dStack_78._16_4_ = (undefined4)((ulong)*puVar1 >> 0x20);
    dStack_78._8_4_ = (undefined4)uVar4;
    dStack_78._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    local_50._M_f = (offset_in_http_stream_to_subr)connected;
    local_50._8_8_ = 0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._8_8_ = 0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl._M_invoker = h->_M_invoker;
    p_Var3 = (h->super__Function_base)._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(h->super__Function_base)._M_functor;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
      (h->super__Function_base)._M_manager = (_Manager_type)0x0;
      h->_M_invoker = (_Invoker_type)0x0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager = p_Var3;
    }
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Head_base<0UL,_libtorrent::http_stream_*,_false>._M_head_impl = this;
    boost::asio::
    basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_connect<std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
              ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)this,(endpoint_type *)&dStack_78.base,&local_50);
    if (local_50._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_manager)
                ((_Any_data *)&local_50._M_bound_args,(_Any_data *)&local_50._M_bound_args,
                 __destroy_functor);
    }
  }
  return;
}

Assistant:

void http_stream::name_lookup(error_code const& e, tcp::resolver::iterator i
		, handler_type& h)
	{
		if (handle_error(e, h)) return;

		m_sock.async_connect(i->endpoint(), std::bind(
			&http_stream::connected, this, _1, std::move(h)));
	}